

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O1

void plutovg_canvas_stroke_extents(plutovg_canvas_t *canvas,plutovg_rect_t *extents)

{
  plutovg_state_t *ppVar1;
  float fVar2;
  float fVar3;
  
  ppVar1 = canvas->state;
  fVar3 = (ppVar1->stroke).style.width * 0.5;
  fVar2 = fVar3;
  if ((ppVar1->stroke).style.join == PLUTOVG_LINE_JOIN_MITER) {
    fVar2 = (ppVar1->stroke).style.miter_limit * fVar3;
  }
  if ((ppVar1->stroke).style.cap == PLUTOVG_LINE_CAP_SQUARE) {
    fVar3 = fVar3 * 1.4142135;
  }
  if (fVar3 <= fVar2) {
    fVar3 = fVar2;
  }
  plutovg_path_extents(canvas->path,extents,true);
  extents->x = extents->x - fVar3;
  extents->y = extents->y - fVar3;
  extents->w = extents->w + fVar3 + fVar3;
  extents->h = fVar3 + fVar3 + extents->h;
  plutovg_matrix_map_rect(&canvas->state->matrix,extents,extents);
  return;
}

Assistant:

void plutovg_canvas_stroke_extents(const plutovg_canvas_t* canvas, plutovg_rect_t* extents)
{
    plutovg_stroke_data_t* stroke = &canvas->state->stroke;
    float cap_limit = stroke->style.width / 2.f;
    if(stroke->style.cap == PLUTOVG_LINE_CAP_SQUARE)
        cap_limit *= PLUTOVG_SQRT2;
    float join_limit = stroke->style.width / 2.f;
    if(stroke->style.join == PLUTOVG_LINE_JOIN_MITER) {
        join_limit *= stroke->style.miter_limit;
    }

    float delta = plutovg_max(cap_limit, join_limit);
    plutovg_path_extents(canvas->path, extents, true);
    extents->x -= delta;
    extents->y -= delta;
    extents->w += delta * 2.f;
    extents->h += delta * 2.f;
    plutovg_canvas_map_rect(canvas, extents, extents);
}